

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O1

void __thiscall Polymer::Bind(Polymer *this,Ptr *pol,string *promoter_name)

{
  element_type *peVar1;
  long lVar2;
  BindingSite *pBVar3;
  bool bVar4;
  int iVar5;
  SpeciesTracker *pSVar6;
  long *plVar7;
  runtime_error *this_00;
  _func_int **pp_Var8;
  byte bVar9;
  pointer pIVar10;
  Ptr elem;
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  results;
  undefined1 local_e0 [40];
  Polymer *local_b8;
  element_type *local_b0;
  _Base_ptr local_a8;
  string local_a0;
  undefined1 local_80 [24];
  intervalVector local_68;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  iVar5 = std::__cxx11::string::compare((char *)promoter_name);
  if (iVar5 == 0) {
    peVar1 = (pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    peVar1->start_ = 1;
    peVar1->stop_ = peVar1->footprint_;
    peVar1->reading_frame_ = 1;
  }
  else {
    local_80._0_8_ = (pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_80._8_8_ =
         (pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_)->_M_use_count + 1;
      }
    }
    FindBindingSite((Polymer *)local_e0,(Ptr *)this,(string *)local_80);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
    }
    peVar1 = (pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar5 = *(int *)(local_e0._0_8_ + 0x38);
    peVar1->start_ = iVar5;
    peVar1->stop_ = iVar5 + -1 + peVar1->footprint_;
    peVar1->reading_frame_ = *(int *)(local_e0._0_8_ + 0x98);
    iVar5 = std::__cxx11::string::compare((char *)&peVar1->name_);
    if (iVar5 == 0) {
      peVar1 = (pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,*(_func_int **)(local_e0._0_8_ + 0x70),
                 *(_func_int **)(local_e0._0_8_ + 0x78) +
                 (long)*(_func_int **)(local_e0._0_8_ + 0x70));
      std::__cxx11::string::_M_assign((string *)&peVar1->gene_bound_);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    if ((element_type *)local_e0._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_);
    }
  }
  peVar1 = (pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((this->mask_).super_MobileElement.start_ <= peVar1->stop_) {
    std::operator+(&local_a0,"MobileElement ",&peVar1->name_);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_a0);
    local_e0._0_8_ = *plVar7;
    pp_Var8 = (_func_int **)(plVar7 + 2);
    if ((_func_int **)local_e0._0_8_ == pp_Var8) {
      local_e0._16_8_ = *pp_Var8;
      local_e0._24_8_ = plVar7[3];
      local_e0._0_8_ = local_e0 + 0x10;
    }
    else {
      local_e0._16_8_ = *pp_Var8;
    }
    local_e0._8_8_ = plVar7[1];
    *plVar7 = (long)pp_Var8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,(string *)local_e0);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_68.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0._32_8_ = pol;
  local_b8 = this;
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findOverlapping
            (&this->binding_sites_,(long)peVar1->start_,(long)peVar1->stop_,&local_68);
  local_80._16_8_ =
       local_68.
       super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (local_68.
      super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pIVar10 = local_68.
              super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      lVar2 = *(long *)((long)pIVar10 + 0x10);
      iVar5 = *(int *)(lVar2 + 0x90);
      *(int *)(lVar2 + 0x90) = iVar5 + 1;
      if (-1 < iVar5 && *(int *)(lVar2 + 0x94) == 0) {
        LogCover(local_b8,(string *)(lVar2 + 0x18));
      }
      *(undefined4 *)(*(long *)((long)pIVar10 + 0x10) + 0x94) =
           *(undefined4 *)(*(long *)((long)pIVar10 + 0x10) + 0x90);
      iVar5 = std::__cxx11::string::compare
                        ((char *)&((__shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2> *)
                                  local_e0._32_8_)->_M_ptr->name_);
      if (iVar5 == 0) {
        bVar4 = false;
      }
      else {
        pBVar3 = *(BindingSite **)((long)pIVar10 + 0x10);
        local_e0._0_8_ = local_e0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"__ribosome","");
        bVar4 = BindingSite::CheckInteraction(pBVar3,(string *)local_e0);
        if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
          operator_delete((void *)local_e0._0_8_);
        }
      }
      if (bVar4 != false) {
        pSVar6 = SpeciesTracker::Instance();
        SpeciesTracker::IncrementRibo(pSVar6,(string *)(*(long *)((long)pIVar10 + 0x10) + 0x70),1);
      }
      iVar5 = std::__cxx11::string::compare
                        ((char *)&((__shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2> *)
                                  local_e0._32_8_)->_M_ptr->name_);
      if (iVar5 == 0) {
        pBVar3 = *(BindingSite **)((long)pIVar10 + 0x10);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"__ribosome","");
        bVar4 = BindingSite::CheckInteraction(pBVar3,&local_a0);
        if (!bVar4) goto LAB_00118992;
        bVar9 = *(byte *)(*(long *)((long)pIVar10 + 0x10) + 0x9d) ^ 1;
      }
      else {
LAB_00118992:
        bVar9 = 0;
      }
      if ((iVar5 == 0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2)) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if (bVar9 != 0) {
        if (*(char *)(*(long *)((long)pIVar10 + 0x10) + 0x9c) == '\x01') {
          pSVar6 = SpeciesTracker::Instance();
          SpeciesTracker::IncrementTranscript
                    (pSVar6,(string *)(*(long *)((long)pIVar10 + 0x10) + 0x70),-1);
        }
        BindingSite::Degrade(*(BindingSite **)((long)pIVar10 + 0x10));
      }
      pIVar10 = (pointer)((long)pIVar10 + 0x20);
    } while (pIVar10 != (pointer)local_80._16_8_);
  }
  local_b0 = ((__shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2> *)local_e0._32_8_)->_M_ptr;
  local_a8 = (_Base_ptr)
             (((__shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2> *)local_e0._32_8_)->
             _M_refcount)._M_pi;
  if (local_a8 != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_a8->_M_parent = *(int *)&local_a8->_M_parent + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_a8->_M_parent = *(int *)&local_a8->_M_parent + 1;
    }
  }
  (*local_b8->_vptr_Polymer[3])(local_b8,&local_b0);
  if (local_a8 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8);
  }
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~vector(&local_68);
  return;
}

Assistant:

void Polymer::Bind(MobileElement::Ptr pol, const std::string &promoter_name) {
  // Find a free promoter to bind to
  if (promoter_name == "readthrough") {
    pol->start(1);
    pol->stop(pol->footprint());
    pol->reading_frame(1);
  } else {
    auto elem = FindBindingSite(pol, promoter_name);
    // Update polymerase coordinates
    // (TODO: refactor; pol doesn't need to expose footprint/stop position)
    pol->start(elem->start());
    pol->stop(elem->start() + pol->footprint() - 1);
    pol->reading_frame(elem->reading_frame());
    // Only set gene_bound_ for transcripts and ribosomesinit
    if (pol->name() == "__ribosome") {
      pol->gene_bound(elem->gene());
    }
  }
  // More error checking.
  if (pol->stop() >= mask_.start()) {
    std::string err = "MobileElement " + pol->name() +
                      " will overlap with mask upon promoter binding. This may "
                      "cause the polymerase to stall and produce unexpected "
                      "behavior.";
    throw std::runtime_error(err);
  }
  std::vector<Interval<BindingSite::Ptr>> results;
  binding_sites_.findOverlapping(pol->start(), pol->stop(), results);
  for (auto &interval : results) {
    interval.value->Cover();
    if (interval.value->WasCovered()) {
      // Cover promoter in cache
      LogCover(interval.value->name());
    }
    interval.value->ResetState();
    // Report some data to tracker
    if (pol->name() != "__rnase" &&
        interval.value->CheckInteraction("__ribosome")) {
      auto &tracker = SpeciesTracker::Instance();
      tracker.IncrementRibo(interval.value->gene(), 1);
    }
    if (pol->name() == "__rnase" &&
        interval.value->CheckInteraction("__ribosome") &&
        interval.value->degraded() == false) {
      // Only decrement transcript count if this binding site has
      // been exposed and logged by SpeciesTracker before
      if (interval.value->first_exposure() == true) {
        auto &tracker = SpeciesTracker::Instance();
        tracker.IncrementTranscript(interval.value->gene(), -1);
      }
      interval.value->Degrade();
    }
  }
  // Add polymerase to this polymer
  Attach(pol);
}